

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::_readFileReal
          (SoPlexBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars)

{
  Settings *pSVar1;
  int iVar2;
  
  Statistics::clearAllData(this->_statistics);
  clearBasis(this);
  _invalidateSolution(this);
  this->_status = UNKNOWN;
  (*this->_statistics->readingTime->_vptr_Timer[3])();
  iVar2 = (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1f])
                    (this->_realLP,filename,rowNames,colNames,intVars);
  (*this->_statistics->readingTime->_vptr_Timer[4])();
  if (SUB41(iVar2,0) == false) {
    clearLPReal(this);
  }
  else {
    setIntParam(this,OBJSENSE,(uint)(this->_realLP->thesense == MAXIMIZE) * 2 + -1,true);
    pSVar1 = this->_currentSettings;
    this->_realLP->offset = pSVar1->_realParamValues[0x17];
    if (pSVar1->_intParamValues[0xf] == 1) {
      _syncLPRational(this,true);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool SoPlexBase<R>::_readFileReal(const char* filename, NameSet* rowNames, NameSet* colNames,
                                  DIdxSet* intVars)
{
   assert(_realLP != nullptr);

   // clear statistics
   _statistics->clearAllData();

   // update status
   clearBasis();
   _invalidateSolution();
   _status = SPxSolverBase<R>::UNKNOWN;

   // start timing
   _statistics->readingTime->start();

   // read
   bool success = _realLP->readFile(filename, rowNames, colNames, intVars);

   // stop timing
   _statistics->readingTime->stop();

   if(success)
   {
      setIntParam(SoPlexBase<R>::OBJSENSE,
                  (_realLP->spxSense() == SPxLPBase<R>::MAXIMIZE ? SoPlexBase<R>::OBJSENSE_MAXIMIZE :
                   SoPlexBase<R>::OBJSENSE_MINIMIZE), true);
      _realLP->changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));

      // if sync mode is auto, we have to copy the (rounded) R LP to the rational LP; this is counted to sync time
      // and not to reading time
      if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
         _syncLPRational();
   }
   else
      clearLPReal();

   return success;
}